

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O0

void write_prefix_nal_unit_svc(nal_t *nal,bs_t *b)

{
  int iVar1;
  bs_t *b_local;
  nal_t *nal_local;
  
  if (nal->nal_ref_idc == 0) {
    iVar1 = more_rbsp_data(b);
    if (iVar1 != 0) {
      while (iVar1 = more_rbsp_data(b), iVar1 != 0) {
        bs_write_u1(b,(uint)(nal->prefix_nal_svc->additional_prefix_nal_unit_extension_data_flag & 1
                            ));
      }
    }
  }
  else {
    bs_write_u1(b,(uint)(nal->prefix_nal_svc->store_ref_base_pic_flag & 1));
    if ((((nal->nal_svc_ext->use_ref_base_pic_flag & 1U) != 0) ||
        ((nal->prefix_nal_svc->store_ref_base_pic_flag & 1U) != 0)) &&
       ((nal->nal_svc_ext->idr_flag & 1U) == 0)) {
      write_dec_ref_base_pic_marking(nal,b);
    }
    bs_write_u1(b,(uint)(nal->prefix_nal_svc->additional_prefix_nal_unit_extension_flag & 1));
    if ((nal->prefix_nal_svc->additional_prefix_nal_unit_extension_flag & 1U) != 0) {
      while (iVar1 = more_rbsp_data(b), iVar1 != 0) {
        bs_write_u1(b,(uint)(nal->prefix_nal_svc->additional_prefix_nal_unit_extension_data_flag & 1
                            ));
      }
    }
  }
  return;
}

Assistant:

void write_prefix_nal_unit_svc(nal_t* nal, bs_t* b)
{
    if( nal->nal_ref_idc != 0 )
    {
        bs_write_u1(b, nal->prefix_nal_svc->store_ref_base_pic_flag);
        if( ( nal->nal_svc_ext->use_ref_base_pic_flag || nal->prefix_nal_svc->store_ref_base_pic_flag ) &&
             !nal->nal_svc_ext->idr_flag )
        {
            write_dec_ref_base_pic_marking( nal, b );
        }
        bs_write_u1(b, nal->prefix_nal_svc->additional_prefix_nal_unit_extension_flag);
        if( nal->prefix_nal_svc->additional_prefix_nal_unit_extension_flag )
        {
            while( more_rbsp_data( b ) )
            {
                bs_write_u1(b, nal->prefix_nal_svc->additional_prefix_nal_unit_extension_data_flag);
            }
        }
    }
    else if( more_rbsp_data( b ) )
    {
        while( more_rbsp_data( b ) )
        {
            bs_write_u1(b, nal->prefix_nal_svc->additional_prefix_nal_unit_extension_data_flag);
        }
    }
}